

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::NestedLoopJoinThresholdSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  ClientConfig CStack_1f8;
  
  switchD_0049f7f1::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  pCVar1 = ClientConfig::GetConfig(context);
  pCVar1->nested_loop_join_threshold = CStack_1f8.nested_loop_join_threshold;
  ClientConfig::~ClientConfig(&CStack_1f8);
  return;
}

Assistant:

void NestedLoopJoinThresholdSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).nested_loop_join_threshold = ClientConfig().nested_loop_join_threshold;
}